

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

int main(void)

{
  test_location<void_(*)()> test;
  test_location<void_(*)()> test_00;
  test_location<void_(*)()> test_01;
  test_location<void_(*)()> test_02;
  test_location<void_(*)()> test_03;
  test_location<void_(*)()> test_04;
  test_location<void_(*)()> test_05;
  test_location<void_(*)()> test_06;
  test_location<void_(*)()> test_07;
  test_location<void_(*)()> test_08;
  test_location<void_(*)()> test_09;
  test_location<void_(*)()> test_10;
  test_location<void_(*)()> test_11;
  test_location<void_(*)()> test_12;
  test_location<void_(*)()> test_13;
  test local_1b0;
  code *local_178;
  char *pcStack_170;
  undefined4 local_168;
  undefined4 uStack_164;
  code *local_160;
  char *pcStack_158;
  undefined4 local_150;
  undefined4 uStack_14c;
  code *local_148;
  char *pcStack_140;
  undefined4 local_138;
  undefined4 uStack_134;
  code *local_130;
  char *pcStack_128;
  undefined4 local_120;
  undefined4 uStack_11c;
  code *local_118;
  char *pcStack_110;
  undefined4 local_108;
  undefined4 uStack_104;
  code *local_100;
  char *pcStack_f8;
  undefined4 local_f0;
  undefined4 uStack_ec;
  code *local_e8;
  char *pcStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  code *local_d0;
  char *pcStack_c8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  code *local_b8;
  char *pcStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  code *local_a0;
  char *pcStack_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  code *local_88;
  char *pcStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  code *local_70;
  char *pcStack_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  code *local_58;
  char *pcStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  code *local_40;
  char *pcStack_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  code *local_28;
  char *pcStack_20;
  undefined4 local_18;
  undefined4 uStack_14;
  
  local_28 = main::anon_class_1_0_00000001::__invoke;
  pcStack_20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_18 = 0x2a;
  local_1b0.name.data_ = "named objective";
  local_1b0.name.size_ = 0xf;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test.location._12_4_ = uStack_14;
  test.location.line_ = 0x2a;
  test.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_40 = main::anon_class_1_0_00000001::__invoke;
  pcStack_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_30 = 0x3f;
  local_1b0.name.data_ = "no-named objective";
  local_1b0.name.size_ = 0x12;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_00.location._12_4_ = uStack_2c;
  test_00.location.line_ = 0x3f;
  test_00.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_00.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_00);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_58 = main::anon_class_1_0_00000001::__invoke;
  pcStack_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_48 = 0x52;
  local_1b0.name.data_ = "small lp";
  local_1b0.name.size_ = 8;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_01.location._12_4_ = uStack_44;
  test_01.location.line_ = 0x52;
  test_01.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_01.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_01);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_70 = main::anon_class_1_0_00000001::__invoke;
  pcStack_68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_60 = 0x98;
  local_1b0.name.data_ = "quadratic lp";
  local_1b0.name.size_ = 0xc;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_02.location._12_4_ = uStack_5c;
  test_02.location.line_ = 0x98;
  test_02.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_02.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_02);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_88 = main::anon_class_1_0_00000001::__invoke;
  pcStack_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_78 = 0xe3;
  local_1b0.name.data_ = "quadratic 2";
  local_1b0.name.size_ = 0xb;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_03.location._12_4_ = uStack_74;
  test_03.location.line_ = 0xe3;
  test_03.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_03.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_03);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_a0 = main::anon_class_1_0_00000001::__invoke;
  pcStack_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_90 = 0x138;
  local_1b0.name.data_ = "quadratic 3";
  local_1b0.name.size_ = 0xb;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_04.location._12_4_ = uStack_8c;
  test_04.location.line_ = 0x138;
  test_04.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_04.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_04);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_b8 = main::anon_class_1_0_00000001::__invoke;
  pcStack_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_a8 = 0x187;
  local_1b0.name.data_ = "quadratic 4";
  local_1b0.name.size_ = 0xb;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_05.location._12_4_ = uStack_a4;
  test_05.location.line_ = 0x187;
  test_05.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_05.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_05);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_d0 = main::anon_class_1_0_00000001::__invoke;
  pcStack_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_c0 = 0x1d2;
  local_1b0.name.data_ = "quadratic 5";
  local_1b0.name.size_ = 0xb;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_06.location._12_4_ = uStack_bc;
  test_06.location.line_ = 0x1d2;
  test_06.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_06.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_06);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_e8 = main::anon_class_1_0_00000001::__invoke;
  pcStack_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_d8 = 0x227;
  local_1b0.name.data_ = "quadratic 6";
  local_1b0.name.size_ = 0xb;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_07.location._12_4_ = uStack_d4;
  test_07.location.line_ = 0x227;
  test_07.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_07.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_07);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_100 = main::anon_class_1_0_00000001::__invoke;
  pcStack_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_f0 = 0x276;
  local_1b0.name.data_ = "assignment_problem 0";
  local_1b0.name.size_ = 0x14;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_08.location._12_4_ = uStack_ec;
  test_08.location.line_ = 0x276;
  test_08.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_08.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_08);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_118 = main::anon_class_1_0_00000001::__invoke;
  pcStack_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_108 = 0x295;
  local_1b0.name.data_ = "geom-30a-3-ext_1000_support";
  local_1b0.name.size_ = 0x1b;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_09.location._12_4_ = uStack_104;
  test_09.location.line_ = 0x295;
  test_09.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_09.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_09);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_130 = main::anon_class_1_0_00000001::__invoke;
  pcStack_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_120 = 0x2a6;
  local_1b0.name.data_ = "general";
  local_1b0.name.size_ = 7;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_10.location._12_4_ = uStack_11c;
  test_10.location.line_ = 0x2a6;
  test_10.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_10.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_10);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_148 = main::anon_class_1_0_00000001::__invoke;
  pcStack_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_138 = 0x2b6;
  local_1b0.name.data_ = "sudoku";
  local_1b0.name.size_ = 6;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_11.location._12_4_ = uStack_134;
  test_11.location.line_ = 0x2b6;
  test_11.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_11.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_11);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_160 = main::anon_class_1_0_00000001::__invoke;
  pcStack_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_150 = 0x2c4;
  local_1b0.name.data_ = "8_queens_puzzle";
  local_1b0.name.size_ = 0xf;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_12.location._12_4_ = uStack_14c;
  test_12.location.line_ = 0x2c4;
  test_12.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_12.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_12);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_178 = main::anon_class_1_0_00000001::__invoke;
  pcStack_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  local_1b0.type.data_ = "test";
  local_1b0.type.size_ = 4;
  local_168 = 0x2d3;
  local_1b0.name.data_ = "vm";
  local_1b0.name.size_ = 2;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.tag.
  super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test_13.location._12_4_ = uStack_164;
  test_13.location.line_ = 0x2d3;
  test_13.location.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/test/io.cpp";
  test_13.test = main::anon_class_1_0_00000001::__invoke;
  boost::ext::ut::v1_1_8::detail::test::operator=<>(&local_1b0,test_13);
  if (local_1b0.tag.
      super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.tag.
                    super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.tag.
                          super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int
main()
{
    using namespace boost::ut;

    "named objective"_test = [] {
        const char* example = "maximize\n"
            "x0: +x1 + 2x2 + 3x3 - 100\n"
            "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example);

        auto pb = baryonyx::make_problem(*ctx, iss);
        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3_ul);
        expect(pb.objective.elements[0].factor == 1_i);
        expect(pb.objective.elements[0].variable_index == 0_i);
        expect(pb.objective.elements[1].factor == 2_i);
        expect(pb.objective.elements[1].variable_index == 1_i);
        expect(pb.objective.elements[2].factor == 3_i);
        expect(pb.objective.elements[2].variable_index == 2_i);
        expect(pb.objective.value == -100.0_d);
    };

    "no-named objective"_test = [] {
        const char* example = "maximize\n"
            "st: x1 + x2 + x3 = 1\n"
            "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example);

        auto pb = baryonyx::make_problem(*ctx, iss);
        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 0_ul);
        expect(pb.vars.names.size() == 3_ul);
        expect(pb.vars.values.size() == 3_ul);
        expect(pb.less_constraints.size() == 0_ul);
        expect(pb.greater_constraints.size() == 0_ul);
        expect(pb.equal_constraints.size() == 1_ul);
    };

    "small lp"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);
        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3_ul);
        expect(pb.objective.elements[0].factor == 1_i);
        expect(pb.objective.elements[0].variable_index == 0_i);
        expect(pb.objective.elements[1].factor == 2_i);
        expect(pb.objective.elements[1].variable_index == 1_i);
        expect(pb.objective.elements[2].factor == 3_i);
        expect(pb.objective.elements[2].variable_index == 2_i);
        expect(pb.objective.value == -100.0_d);

        expect(pb.vars.names.size() == 3_ul);
        expect(pb.vars.values.size() == 3_ul);
        expect(pb.less_constraints.size() == 3_ul);

        expect(pb.less_constraints[0].elements.size() == 3_ul);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0_i);
        expect(pb.less_constraints[0].elements[1].factor == 1_i);
        expect(pb.less_constraints[0].elements[1].variable_index == 1_i);
        expect(pb.less_constraints[0].elements[2].factor == 1_i);
        expect(pb.less_constraints[0].elements[2].variable_index == 2_i);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3_ul);
        expect(pb.less_constraints[1].elements[0].factor == 1_i);
        expect(pb.less_constraints[1].elements[0].variable_index == 0_i);
        expect(pb.less_constraints[1].elements[1].factor == -3_i);
        expect(pb.less_constraints[1].elements[1].variable_index == 1_i);
        expect(pb.less_constraints[1].elements[2].factor == 1_i);
        expect(pb.less_constraints[1].elements[2].variable_index == 2_i);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3_ul);
        expect(pb.less_constraints[1].elements[0].factor == 1_i);
        expect(pb.less_constraints[2].elements[0].variable_index == 0_i);
        expect(pb.less_constraints[2].elements[1].factor == -3_i);
        expect(pb.less_constraints[2].elements[1].variable_index == 1_i);
        expect(pb.less_constraints[2].elements[2].factor == 1_i);
        expect(pb.less_constraints[2].elements[2].variable_index == 2_i);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0_i);
        expect(pb.vars.values[1].min == 0_i);
        expect(pb.vars.values[2].min == 0_i);

        expect(pb.vars.values[0].max == 40_i);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic lp"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "- [] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 0);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 2"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "- [ -x1^2 - 17x1*x2 + 5x2^2] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 3);

        expect(pb.objective.qelements[0].factor == 1.0 / 2.0);
        expect(pb.objective.qelements[0].variable_index_a == 0);
        expect(pb.objective.qelements[0].variable_index_b == 0);
        expect(pb.objective.qelements[1].factor == 17.0 / 2.0);
        expect(pb.objective.qelements[1].variable_index_a == 0);
        expect(pb.objective.qelements[1].variable_index_b == 1);
        expect(pb.objective.qelements[2].factor == -5.0 / 2.0);
        expect(pb.objective.qelements[2].variable_index_a == 1);
        expect(pb.objective.qelements[2].variable_index_b == 1);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 3"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "- [ -x1*x2 - 17x1*x2 + 5x1*x2] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 1);

        expect(pb.objective.qelements[0].factor == 13.0 / 2.0);
        expect(pb.objective.qelements[0].variable_index_a == 0);
        expect(pb.objective.qelements[0].variable_index_b == 1);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 4"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "+ [] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 0);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 5"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "+ [ -x1^2 - 17x1*x2 + 5x2^2] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 3);

        expect(pb.objective.qelements[0].factor == -1.0 / 2.0);
        expect(pb.objective.qelements[0].variable_index_a == 0);
        expect(pb.objective.qelements[0].variable_index_b == 0);
        expect(pb.objective.qelements[1].factor == -17.0 / 2.0);
        expect(pb.objective.qelements[1].variable_index_a == 0);
        expect(pb.objective.qelements[1].variable_index_b == 1);
        expect(pb.objective.qelements[2].factor == 5.0 / 2.0);
        expect(pb.objective.qelements[2].variable_index_a == 1);
        expect(pb.objective.qelements[2].variable_index_b == 1);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "quadratic 6"_test = [] {
        const char* example_1 = "maximize\n"
                                "obj: x1 + 2x2 + 3x3 "
                                "+ [ -x1*x2 - 17x1*x2 + 5x1*x2] /2 - 100\n"
                                "st\n"
                                "time:  -x1 + x2 + x3 <= 20\n"
                                "labor:  x1 - 3x2 + x3 <= 30\n"
                                "test: x1 - 3x2 + x3 <= -5\n"
                                "bounds\n"
                                "x1 <= 40\n"
                                "end\n";

        auto ctx = baryonyx::make_context(4);
        std::istringstream iss(example_1);

        auto pb = baryonyx::make_problem(*ctx, iss);

        expect(pb);
        expect(pb.type == baryonyx::objective_function_type::maximize);
        expect(pb.objective.elements.size() == 3);
        expect(pb.objective.elements[0].factor == 1);
        expect(pb.objective.elements[0].variable_index == 0);
        expect(pb.objective.elements[1].factor == 2);
        expect(pb.objective.elements[1].variable_index == 1);
        expect(pb.objective.elements[2].factor == 3);
        expect(pb.objective.elements[2].variable_index == 2);

        expect(pb.objective.qelements.size() == 1);

        expect(pb.objective.qelements[0].factor == -13.0 / 2.0);
        expect(pb.objective.qelements[0].variable_index_a == 0);
        expect(pb.objective.qelements[0].variable_index_b == 1);

        expect(pb.objective.value == -100);

        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);
        expect(pb.less_constraints.size() == 3);

        expect(pb.less_constraints[0].elements.size() == 3);
        expect(pb.less_constraints[0].elements[0].factor == -1);
        expect(pb.less_constraints[0].elements[0].variable_index == 0);
        expect(pb.less_constraints[0].elements[1].factor == 1);
        expect(pb.less_constraints[0].elements[1].variable_index == 1);
        expect(pb.less_constraints[0].elements[2].factor == 1);
        expect(pb.less_constraints[0].elements[2].variable_index == 2);
        expect(pb.less_constraints[0].value == 20);

        expect(pb.less_constraints[1].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[1].elements[0].variable_index == 0);
        expect(pb.less_constraints[1].elements[1].factor == -3);
        expect(pb.less_constraints[1].elements[1].variable_index == 1);
        expect(pb.less_constraints[1].elements[2].factor == 1);
        expect(pb.less_constraints[1].elements[2].variable_index == 2);
        expect(pb.less_constraints[1].value == 30);

        expect(pb.less_constraints[2].elements.size() == 3);
        expect(pb.less_constraints[1].elements[0].factor == 1);
        expect(pb.less_constraints[2].elements[0].variable_index == 0);
        expect(pb.less_constraints[2].elements[1].factor == -3);
        expect(pb.less_constraints[2].elements[1].variable_index == 1);
        expect(pb.less_constraints[2].elements[2].factor == 1);
        expect(pb.less_constraints[2].elements[2].variable_index == 2);
        expect(pb.less_constraints[2].value == -5);

        expect(pb.vars.names[0] == "x1");
        expect(pb.vars.names[1] == "x2");
        expect(pb.vars.names[2] == "x3");

        expect(pb.vars.values[0].min == 0);
        expect(pb.vars.values[1].min == 0);
        expect(pb.vars.values[2].min == 0);

        expect(pb.vars.values[0].max == 40);
        expect(pb.vars.values[1].max == std::numeric_limits<int>::max());
        expect(pb.vars.values[2].max == std::numeric_limits<int>::max());
    };

    "assignment_problem 0"_test = [] {
        auto ctx = baryonyx::make_context(4);
        std::ifstream ifs;

        std::vector<std::vector<int>> values(3);

        values[0] = { 0, 0, 1, 0, 0, 1, 0, 0, 1, 0, 0, 0, 0, 0, 0, 1 };
        values[1] = { 0, 1, 0, 0, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0 };
        values[2] = { 0, 1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1, 1, 0, 0, 0 };

        for (int i = 1; i != 4; ++i) {
            std::string filepath{ EXAMPLES_DIR "/assignment_problem_" };
            filepath += std::to_string(i);
            filepath += ".lp";

            auto pb = baryonyx::make_problem(ctx, filepath);

            expect(pb);
            expect(pb.status == baryonyx::file_format_error_tag::success);
            expect(pb.vars.names.size() == 16);
            expect(pb.vars.values.size() == 16);

            std::stringstream ss;
            ss << pb;

            auto pb2 = baryonyx::make_problem(*ctx, ss);

            expect(pb == pb2);
        }
    };

    "geom-30a-3-ext_1000_support"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(
          ctx, EXAMPLES_DIR "/geom-30a-3-ext_1000_support.lp");

        expect(pb.type == baryonyx::objective_function_type::minimize);
        expect(pb.vars.names.size() == 819);
        expect(pb.vars.values.size() == 819);

        baryonyx::index nb{ 0 };
        for (auto& elem : pb.vars.values)
            if (elem.type == baryonyx::variable_type::binary)
                ++nb;

        expect(nb == 90);
    };

    "general"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/general.lp");

        expect(pb.type == baryonyx::objective_function_type::minimize);
        expect(pb.vars.names.size() == 3);
        expect(pb.vars.values.size() == 3);

        baryonyx::index nb{ 0 };
        for (auto& elem : pb.vars.values)
            if (elem.type == baryonyx::variable_type::general)
                ++nb;

        expect(nb == 3);
    };

    "sudoku"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/sudoku.lp");

        expect(pb.vars.names.size() == 81);
        expect(pb.vars.values.size() == 81);

        for (auto& vv : pb.vars.values) {
            expect(vv.min == 1);
            expect(vv.max == 9);
            expect(vv.type == baryonyx::variable_type::general);
        }
    };

    "8_queens_puzzle"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb =
          baryonyx::make_problem(ctx, EXAMPLES_DIR "/8_queens_puzzle.lp");

        expect(pb.vars.names.size() == 64);
        expect(pb.vars.values.size() == 64);

        for (auto& vv : pb.vars.values) {
            expect(vv.min == 0);
            expect(vv.max == 1);
            expect(vv.type == baryonyx::variable_type::binary);
        }
    };

    "vm"_test = [] {
        auto ctx = baryonyx::make_context(4);
        auto pb = baryonyx::make_problem(ctx, EXAMPLES_DIR "/vm.lp");
    };
}